

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_p.h
# Opt level: O1

QStorageInfo QStorageInfoPrivate::root(void)

{
  QExplicitlySharedDataPointer<QStorageInfoPrivate> in_RDI;
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)0x0;
  local_28.d.ptr = L"/";
  local_28.d.size = 1;
  QStorageInfo::QStorageInfo((QStorageInfo *)in_RDI.d.ptr,&local_28);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QExplicitlySharedDataPointer<QStorageInfoPrivate>)
           (QExplicitlySharedDataPointer<QStorageInfoPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QStorageInfo root()
    {
#ifdef Q_OS_WIN
        return QStorageInfo(QDir::fromNativeSeparators(QFile::decodeName(qgetenv("SystemDrive"))));
#else
        return QStorageInfo(QStringLiteral("/"));
#endif
    }